

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

PrepareResult __thiscall Statement::prepareStatement(Statement *this,string *st)

{
  char *__s1;
  int iVar1;
  PrepareResult PVar2;
  string local_48;
  
  __s1 = (st->_M_dataplus)._M_p;
  iVar1 = strncmp(__s1,"insert",6);
  if (iVar1 == 0) {
    this->type = Insert;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,__s1,__s1 + st->_M_string_length);
    PVar2 = prepareInsert(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)st);
    PVar2 = PrepareUnrecognized;
    if (iVar1 == 0) {
      this->type = Select;
      PVar2 = PrepareSuccess;
    }
  }
  return PVar2;
}

Assistant:

PrepareResult Statement::prepareStatement(std::string st) {
	if (strncmp(st.c_str(), "insert", 6) == 0) {
		type = Insert;
		return prepareInsert(st);
	}
	if (st == "select") {
		type = Select;
		return PrepareSuccess;
	}

	return PrepareUnrecognized;
}